

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall license::test::env_var_not_defined::test_method(env_var_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  long local_180 [2];
  shared_count sStack_170;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  undefined1 local_138 [24];
  char *local_120;
  char *local_118;
  char *local_110;
  EventRegistry registry;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  unsetenv("LICENSE_LOCATION");
  locate::LocatorFactory::find_license_near_moduleb = 0;
  locate::LocatorFactory::find_license_with_env_varb = 1;
  LicenseReader::LicenseReader(&licenseReader,(LicenseLocation *)0x0);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_138,"PRODUCT",(allocator *)local_180);
  LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_138,&licenseInfos);
  std::__cxx11::string::~string((string *)local_138);
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x54);
  bVar1 = EventRegistry::isGood(&registry);
  local_180[0] = CONCAT71(local_180[0]._1_7_,!bVar1);
  local_180[1] = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_120 = (char *)&local_118;
  local_118 = "!registry.isGood()";
  local_110 = "";
  local_138[8] = 0;
  local_138._0_8_ = &PTR__lazy_ostream_001cf238;
  local_138._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_50 = "";
  boost::test_tools::tt_detail::report_assertion(local_180,local_138,&local_58,0x54,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x55);
  local_138[8] = 0;
  local_138._0_8_ = &PTR__lazy_ostream_001cf288;
  local_138._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_80 = "";
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_180[0] = ((long)licenseInfos.
                        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_138,&local_88,0x55,1,2,&local_118,"0",local_180,"licenseInfos.size()");
  pAVar2 = EventRegistry::getLastFailure(&registry);
  if (pAVar2 != (AuditEvent *)0x0) {
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
    ;
    local_90 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x58);
    pAVar2 = EventRegistry::getLastFailure(&registry);
    local_180[0] = CONCAT71(local_180[0]._1_7_,
                            pAVar2->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED);
    local_180[1] = 0;
    sStack_170.pi_ = (sp_counted_base *)0x0;
    local_138[8] = 0;
    local_138._0_8_ = &PTR__lazy_ostream_001cf388;
    local_138._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_120 = "error as expected";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_170);
    EventRegistry::~EventRegistry(&registry);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure() != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
                ,0x56,"void license::test::env_var_not_defined::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);
	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_MESSAGE((ENVIRONMENT_VARIABLE_NOT_DEFINED == registry.getLastFailure()->event_type),
						"error as expected");
}